

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O1

QSizeF viewItemTextLayout(QTextLayout *textLayout,int lineWidth,int maxHeight,int *lastVisibleLine)

{
  QSizeF QVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar4;
  long in_FS_OFFSET;
  double dVar5;
  double local_78;
  double local_70;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (lastVisibleLine != (int *)0x0) {
    *lastVisibleLine = -1;
  }
  QTextLayout::beginLayout();
  uVar4 = 0;
  local_78 = 0.0;
  local_70 = 0.0;
  do {
    local_48.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_48.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    uVar3 = QTextLayout::createLine();
    local_48.xp = (qreal)CONCAT44(local_48.xp._4_4_,uVar3);
    local_48.yp = (qreal)CONCAT44(extraout_var,extraout_EDX);
    if (CONCAT44(extraout_var,extraout_EDX) == 0) {
      bVar2 = false;
    }
    else {
      QTextLine::setLineWidth((double)lineWidth);
      QTextLine::setPosition(&local_48);
      dVar5 = (double)QTextLine::height();
      local_70 = local_70 + dVar5;
      dVar5 = (double)QTextLine::naturalTextWidth();
      if (dVar5 <= local_78) {
        dVar5 = local_78;
      }
      local_78 = dVar5;
      if (0 < maxHeight && lastVisibleLine != (int *)0x0) {
        dVar5 = (double)QTextLine::height();
        if ((double)maxHeight < dVar5 + local_70) {
          QTextLayout::createLine();
          bVar2 = false;
          *lastVisibleLine = -(uint)(CONCAT44(extraout_var_00,extraout_EDX_00) == 0) | uVar4;
          goto LAB_0032adec;
        }
      }
      uVar4 = uVar4 + 1;
      bVar2 = true;
    }
LAB_0032adec:
    if (!bVar2) {
      QTextLayout::endLayout();
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QVar1.ht = local_70;
        QVar1.wd = local_78;
        return QVar1;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

static QSizeF viewItemTextLayout(QTextLayout &textLayout, int lineWidth, int maxHeight = -1, int *lastVisibleLine = nullptr)
{
    if (lastVisibleLine)
        *lastVisibleLine = -1;
    qreal height = 0;
    qreal widthUsed = 0;
    textLayout.beginLayout();
    int i = 0;
    while (true) {
        QTextLine line = textLayout.createLine();
        if (!line.isValid())
            break;
        line.setLineWidth(lineWidth);
        line.setPosition(QPointF(0, height));
        height += line.height();
        widthUsed = qMax(widthUsed, line.naturalTextWidth());
        // we assume that the height of the next line is the same as the current one
        if (maxHeight > 0 && lastVisibleLine && height + line.height() > maxHeight) {
            const QTextLine nextLine = textLayout.createLine();
            *lastVisibleLine = nextLine.isValid() ? i : -1;
            break;
        }
        ++i;
    }
    textLayout.endLayout();
    return QSizeF(widthUsed, height);
}